

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.c
# Opt level: O0

int ixmlDocument_importNode(IXML_Document *doc,IXML_Node *importNode,int deep,IXML_Node **rtNode)

{
  unsigned_short uVar1;
  IXML_Node *nodeptr;
  IXML_Node *newNode;
  unsigned_short nodeType;
  IXML_Node **rtNode_local;
  int deep_local;
  IXML_Node *importNode_local;
  IXML_Document *doc_local;
  
  *rtNode = (IXML_Node *)0x0;
  if ((doc == (IXML_Document *)0x0) || (importNode == (IXML_Node *)0x0)) {
    doc_local._4_4_ = 0x69;
  }
  else {
    uVar1 = ixmlNode_getNodeType(importNode);
    if (uVar1 == 9) {
      doc_local._4_4_ = 9;
    }
    else {
      nodeptr = ixmlNode_cloneNode(importNode,deep);
      if (nodeptr == (IXML_Node *)0x0) {
        doc_local._4_4_ = 0x6a;
      }
      else {
        ixmlDocument_setOwnerDocument(doc,nodeptr);
        *rtNode = nodeptr;
        doc_local._4_4_ = 0;
      }
    }
  }
  return doc_local._4_4_;
}

Assistant:

int ixmlDocument_importNode(
	IXML_Document *doc, IXML_Node *importNode, int deep, IXML_Node **rtNode)
{
	unsigned short nodeType;
	IXML_Node *newNode;

	*rtNode = NULL;

	if (doc == NULL || importNode == NULL) {
		return IXML_INVALID_PARAMETER;
	}

	nodeType = ixmlNode_getNodeType(importNode);
	if (nodeType == eDOCUMENT_NODE) {
		return IXML_NOT_SUPPORTED_ERR;
	}

	newNode = ixmlNode_cloneNode(importNode, deep);
	if (newNode == NULL) {
		return IXML_FAILED;
	}

	ixmlDocument_setOwnerDocument(doc, newNode);
	*rtNode = newNode;

	return IXML_SUCCESS;
}